

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpResize_Hermite
              (void *arkode_mem,ARKInterp interp,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector y0)

{
  int iVar1;
  ARKodeMem in_RCX;
  long *in_RSI;
  N_Vector *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  ARKodeMem ark_mem;
  sunindextype in_stack_ffffffffffffffc0;
  sunindextype in_stack_ffffffffffffffc4;
  N_Vector *v;
  int local_4;
  
  if (in_RDI == (N_Vector *)0x0) {
    local_4 = -0x15;
  }
  else if (in_RSI == (long *)0x0) {
    local_4 = 0;
  }
  else {
    v = in_RDI;
    iVar1 = arkResizeVec(in_RCX,(ARKVecResizeFn)CONCAT44(in_R8D,in_R9D),in_RDI,
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,(N_Vector)(*in_RSI + 8)
                         ,in_RDI);
    if (iVar1 == 0) {
      local_4 = -0x14;
    }
    else {
      iVar1 = arkResizeVec(in_RCX,(ARKVecResizeFn)CONCAT44(in_R8D,in_R9D),in_RDI,
                           in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                           (N_Vector)(*in_RSI + 0x18),v);
      if (iVar1 == 0) {
        local_4 = -0x14;
      }
      else {
        iVar1 = arkResizeVec(in_RCX,(ARKVecResizeFn)CONCAT44(in_R8D,in_R9D),in_RDI,
                             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                             (N_Vector)(*in_RSI + 0x28),v);
        if (iVar1 == 0) {
          local_4 = -0x14;
        }
        else {
          iVar1 = arkResizeVec(in_RCX,(ARKVecResizeFn)CONCAT44(in_R8D,in_R9D),in_RDI,
                               in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                               (N_Vector)(*in_RSI + 0x30),v);
          if (iVar1 == 0) {
            local_4 = -0x14;
          }
          else {
            *(N_Vector *)(*in_RSI + 0x20) = in_RDI[0x22];
            *(N_Vector *)(*in_RSI + 0x10) = in_RDI[0x23];
            *(N_Vector *)(*in_RSI + 0x38) = in_RDI[0x33];
            *(N_Vector *)(*in_RSI + 0x40) = in_RDI[0x33];
            *(undefined8 *)(*in_RSI + 0x48) = 0;
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int arkInterpResize_Hermite(void* arkode_mem, ARKInterp interp,
                            ARKVecResizeFn resize, void *resize_data,
                            sunindextype lrw_diff, sunindextype liw_diff,
                            N_Vector y0)
{
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* resize vectors */
  if (interp == NULL)  return(ARK_SUCCESS);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &HINT_FOLD(interp)))
    return(ARK_MEM_FAIL);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &HINT_YOLD(interp)))
    return(ARK_MEM_FAIL);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &HINT_FA(interp)))
    return(ARK_MEM_FAIL);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &HINT_FB(interp)))
    return(ARK_MEM_FAIL);

  /* update ynew and fnew pointers */
  HINT_YNEW(interp) = ark_mem->yn;
  HINT_FNEW(interp) = ark_mem->fn;

  /* reinitialize time values */
  HINT_TOLD(interp) = ark_mem->tcur;
  HINT_TNEW(interp) = ark_mem->tcur;
  HINT_H(interp)    = RCONST(0.0);

  return(ARK_SUCCESS);
}